

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlBase64.c
# Opt level: O0

JL_STATUS JlBase64Decode(char *Base64String,void **pData,size_t *pDataSize)

{
  char cVar1;
  ulong uVar2;
  void *Memory;
  bool bVar3;
  ulong local_88;
  size_t i_1;
  size_t i;
  uint8_t byteBlock [3];
  char charBlock [5];
  size_t blockIndex;
  size_t outIndex;
  uint8_t *data;
  size_t dataSize;
  size_t numExtraBytes;
  size_t numTrailingChars;
  size_t numCompleteBlocks;
  ulong uStack_30;
  char ch;
  size_t base64Length;
  JL_STATUS jlStatus;
  size_t *pDataSize_local;
  void **pData_local;
  char *Base64String_local;
  
  uStack_30 = 0;
  if (((Base64String == (char *)0x0) || (pData == (void **)0x0)) || (pDataSize == (size_t *)0x0)) {
    base64Length._4_4_ = JL_STATUS_INVALID_PARAMETER;
  }
  else {
    *pData = (void *)0x0;
    *pDataSize = 0;
    base64Length._4_4_ = JL_STATUS_SUCCESS;
    while( true ) {
      bVar3 = false;
      if (Base64String[uStack_30] != '\0') {
        bVar3 = Base64String[uStack_30] != '=';
      }
      if (!bVar3) goto LAB_0012c36c;
      cVar1 = Base64String[uStack_30];
      if (((((cVar1 < 'A') || ('Z' < cVar1)) && ((cVar1 < 'a' || ('z' < cVar1)))) &&
          ((cVar1 < '0' || ('9' < cVar1)))) && ((cVar1 != '+' && (cVar1 != '/')))) break;
      uStack_30 = uStack_30 + 1;
    }
    base64Length._4_4_ = JL_STATUS_INVALID_DATA;
LAB_0012c36c:
    if (base64Length._4_4_ == JL_STATUS_SUCCESS) {
      uVar2 = uStack_30 >> 2;
      uStack_30 = uStack_30 & 3;
      dataSize = 0;
      data = (uint8_t *)(uVar2 * 3);
      if (uStack_30 != 0) {
        dataSize = uStack_30 - 1;
        data = data + dataSize;
      }
      Memory = WjTestLib_Calloc((size_t)data,1);
      if (Memory == (void *)0x0) {
        base64Length._4_4_ = JL_STATUS_OUT_OF_MEMORY;
      }
      else {
        blockIndex = 0;
        for (_byteBlock = 0; _byteBlock < uVar2; _byteBlock = _byteBlock + 1) {
          Decode4Base64ToBytes(Base64String + _byteBlock * 4,(uint8_t *)((long)Memory + blockIndex))
          ;
          blockIndex = blockIndex + 3;
        }
        if (dataSize == 0) {
          if (uStack_30 != 0) {
            base64Length._4_4_ = JL_STATUS_INVALID_DATA;
          }
        }
        else {
          i._3_4_ = 0x41414141;
          i._7_1_ = 0;
          memset(&i,0,3);
          for (i_1 = 0; i_1 < uStack_30; i_1 = i_1 + 1) {
            byteBlock[i_1 - 5] = Base64String[uVar2 * 4 + i_1];
          }
          Decode4Base64ToBytes((char *)((long)&i + 3),(uint8_t *)&i);
          for (local_88 = 0; local_88 < dataSize; local_88 = local_88 + 1) {
            *(uint8_t *)((long)Memory + blockIndex) = byteBlock[local_88 - 8];
            blockIndex = blockIndex + 1;
          }
        }
        if (base64Length._4_4_ == JL_STATUS_SUCCESS) {
          *pData = Memory;
          *pDataSize = (size_t)data;
        }
        else {
          WjTestLib_Free(Memory);
        }
      }
    }
  }
  return base64Length._4_4_;
}

Assistant:

JL_STATUS
    JlBase64Decode
    (
        char const*         Base64String,
        void**              pData,
        size_t*             pDataSize
    )
{
    JL_STATUS jlStatus;
    size_t base64Length = 0;

    if(     NULL != Base64String
        &&  NULL != pData
        &&  NULL != pDataSize )
    {
        *pData = NULL;
        *pDataSize = 0;

        // Get length of string by looking for a zero terminator OR a padding character.
        // Also validate every character is base64
        jlStatus = JL_STATUS_SUCCESS;
        while( 0 != Base64String[base64Length] && '=' != Base64String[base64Length] )
        {
            const char ch = Base64String[base64Length];
            if(     ( ch >= 'A' && ch <= 'Z' )
                ||  ( ch >= 'a' && ch <= 'z' )
                ||  ( ch >= '0' && ch <= '9' )
                ||  ( '+' == ch )
                ||  ( '/' == ch ) )
            {
                base64Length += 1;
            }
            else
            {
                jlStatus = JL_STATUS_INVALID_DATA;
                break;
            }
        }

        if( JL_STATUS_SUCCESS == jlStatus )
        {
            size_t numCompleteBlocks = base64Length / 4;
            size_t numTrailingChars = base64Length % 4;
            size_t numExtraBytes = 0;

            // Calculate size of output
            size_t dataSize = numCompleteBlocks * 3;
            if( numTrailingChars > 0 )
            {
                numExtraBytes = numTrailingChars - 1;
                dataSize += numExtraBytes;
            }

            uint8_t* data = JlAlloc( dataSize );
            if( NULL != data )
            {
                // Process in blocks of 4 characters forming 3 bytes
                size_t outIndex = 0;
                for( size_t blockIndex=0; blockIndex<numCompleteBlocks; blockIndex+=1 )
                {
                    Decode4Base64ToBytes( Base64String + (blockIndex*4), data + outIndex );
                    outIndex += 3;
                }

                if( numExtraBytes > 0 )
                {
                    // Process the final partial block
                    char charBlock[5] = "AAAA";
                    uint8_t byteBlock[3] = {0};
                    for( size_t i=0; i<numTrailingChars; i++ )
                    {
                        charBlock[i] = Base64String[ (numCompleteBlocks*4) + i ];
                    }
                    Decode4Base64ToBytes( charBlock, byteBlock );

                    // Now copy out the required number of bytes
                    for( size_t i=0; i<numExtraBytes; i++ )
                    {
                        data[outIndex] = byteBlock[i];
                        outIndex += 1;
                    }
                }
                else if( numTrailingChars > 0 && 0 == numExtraBytes )
                {
                    // This occurs if there is 1 character in the trailing block. This only represents 6 bits
                    // and therefore not a complete byte, so the data is truncated. So we report this as corrupt
                    jlStatus = JL_STATUS_INVALID_DATA;
                }

                if( JL_STATUS_SUCCESS == jlStatus )
                {
                    *pData = data;
                    *pDataSize = dataSize;
                }
                else
                {
                    JlFree( data );
                }
            }
            else
            {
                jlStatus = JL_STATUS_OUT_OF_MEMORY;
            }
        }
    }
    else
    {
        jlStatus = JL_STATUS_INVALID_PARAMETER;
    }

    return jlStatus;
}